

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

ZSTD_compressionParameters *
duckdb_zstd::ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  undefined1 (*pauVar1) [12];
  ZSTD_compressionParameters cPar;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined4 uStack_1c;
  
  sVar2 = 0;
  if (mode != ZSTD_cpm_attachDict) {
    sVar2 = dictSize;
  }
  if (srcSizeHint == 0xffffffffffffffff && sVar2 == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    lVar6 = 500;
    if (sVar2 == 0) {
      lVar6 = 0;
    }
    lVar7 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar7 = lVar6;
    }
    uVar3 = sVar2 + srcSizeHint + lVar7;
  }
  if (compressionLevel == 0) {
    uVar5 = 3;
  }
  else if (compressionLevel < 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0x16;
    if ((uint)compressionLevel < 0x16) {
      uVar5 = (ulong)(uint)compressionLevel;
    }
  }
  lVar6 = (ulong)(uVar3 < 0x20001) + (ulong)(uVar3 < 0x40001) + (ulong)(uVar3 < 0x4001);
  lVar7 = uVar5 * 0x1c;
  pauVar1 = (undefined1 (*) [12])(ZSTD_defaultCParameters + lVar7 + lVar6 * 0x284);
  uStack_1c = (undefined4)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
  iVar4 = -0x20000;
  if (0xfffe0000 < (uint)compressionLevel) {
    iVar4 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar4 = -iVar4;
  }
  else {
    iVar4 = *(int *)(ZSTD_defaultCParameters + lVar7 + 0x14 + lVar6 * 0x284);
  }
  cPar.strategy = *(undefined4 *)(ZSTD_defaultCParameters + lVar7 + 0x18 + lVar6 * 0x284);
  cPar.targetLength = iVar4;
  cPar.searchLog = uStack_1c;
  cPar._0_12_ = *pauVar1;
  cPar.minMatch = *(undefined4 *)(ZSTD_defaultCParameters + lVar7 + 0x10 + lVar6 * 0x284);
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode,ZSTD_ps_auto);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode, ZSTD_ps_auto);
    }
}